

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultReporterDisposer.cpp
# Opt level: O0

void __thiscall
ApprovalTests::DefaultReporterDisposer::DefaultReporterDisposer
          (DefaultReporterDisposer *this,shared_ptr<ApprovalTests::Reporter> *reporter)

{
  shared_ptr<ApprovalTests::Reporter> *in_RDI;
  shared_ptr<ApprovalTests::Reporter> local_20 [2];
  
  ::std::shared_ptr<ApprovalTests::Reporter>::shared_ptr
            ((shared_ptr<ApprovalTests::Reporter> *)0x211cf5);
  DefaultReporterFactory::getDefaultReporter();
  ::std::shared_ptr<ApprovalTests::Reporter>::operator=(in_RDI,local_20);
  ::std::shared_ptr<ApprovalTests::Reporter>::~shared_ptr
            ((shared_ptr<ApprovalTests::Reporter> *)0x211d1d);
  DefaultReporterFactory::setDefaultReporter(in_RDI);
  return;
}

Assistant:

DefaultReporterDisposer::DefaultReporterDisposer(
        const std::shared_ptr<Reporter>& reporter)
    {
        previous_result = DefaultReporterFactory::getDefaultReporter();
        DefaultReporterFactory::setDefaultReporter(reporter);
    }